

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

string * PacketProcessor::DickWinder(string *__return_storage_ptr__,string *str,uchar emulti)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  int local_84;
  int i;
  string local_68 [7];
  uchar c;
  string buffer;
  string local_40 [4];
  int length;
  string newstr;
  uchar emulti_local;
  string *str_local;
  
  newstr.field_2._M_local_buf[0xf] = emulti;
  std::__cxx11::string::string(local_40);
  buffer.field_2._12_4_ = std::__cxx11::string::length();
  std::__cxx11::string::string(local_68);
  if (newstr.field_2._M_local_buf[0xf] == '\0') {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  else {
    std::__cxx11::string::reserve((ulong)local_40);
    for (local_84 = 0; local_84 < (int)buffer.field_2._12_4_; local_84 = local_84 + 1) {
      pbVar2 = (byte *)std::__cxx11::string::operator[]((ulong)str);
      bVar1 = *pbVar2;
      if ((int)((ulong)bVar1 % (ulong)(long)(int)(uint)(byte)newstr.field_2._M_local_buf[0xf]) == 0)
      {
        std::__cxx11::string::operator+=(local_68,bVar1);
      }
      else {
        lVar3 = std::__cxx11::string::length();
        if (lVar3 != 0) {
          _Var4._M_current = (char *)std::__cxx11::string::begin();
          _Var5._M_current = (char *)std::__cxx11::string::end();
          std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(_Var4,_Var5);
          std::__cxx11::string::operator+=(local_40,local_68);
          std::__cxx11::string::clear();
        }
        std::__cxx11::string::operator+=(local_40,bVar1);
      }
    }
    lVar3 = std::__cxx11::string::length();
    if (lVar3 != 0) {
      _Var4._M_current = (char *)std::__cxx11::string::begin();
      _Var5._M_current = (char *)std::__cxx11::string::end();
      std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(_Var4,_Var5);
      std::__cxx11::string::operator+=(local_40,local_68);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_40);
  }
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string PacketProcessor::DickWinder(const std::string &str, unsigned char emulti)
{
	std::string newstr;
	int length = str.length();
	std::string buffer;
	unsigned char c;

	if (emulti == 0)
	{
		return str;
	}

	newstr.reserve(length);

	for (int i = 0; i < length; ++i)
	{
		c = str[i];

		if (c % emulti == 0)
		{
			buffer += c;
		}
		else
		{
			if (buffer.length() > 0)
			{
				std::reverse(buffer.begin(), buffer.end());
				newstr += buffer;
				buffer.clear();
			}
			newstr += c;
		}
	}

	if (buffer.length() > 0)
	{
		std::reverse(buffer.begin(), buffer.end());
		newstr += buffer;
	}

	return newstr;
}